

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

real __thiscall fasttext::Matrix::dotRow(Matrix *this,Vector *vec,int64_t i)

{
  real rVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int64_t iVar4;
  real *prVar5;
  runtime_error *this_00;
  long in_RDX;
  long in_RDI;
  int64_t j;
  real d;
  int64_t in_stack_ffffffffffffffa8;
  Matrix *in_stack_ffffffffffffffb0;
  long local_28;
  real local_1c;
  
  if (in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/matrix.cc"
                  ,0x25,"real fasttext::Matrix::dotRow(const Vector &, int64_t) const");
  }
  if (*(long *)(in_RDI + 0x18) <= in_RDX) {
    __assert_fail("i < m_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/matrix.cc"
                  ,0x26,"real fasttext::Matrix::dotRow(const Vector &, int64_t) const");
  }
  iVar4 = Vector::size((Vector *)0x18deb1);
  if (iVar4 != *(long *)(in_RDI + 0x20)) {
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/matrix.cc"
                  ,0x27,"real fasttext::Matrix::dotRow(const Vector &, int64_t) const");
  }
  local_1c = 0.0;
  for (local_28 = 0; local_28 < *(long *)(in_RDI + 0x20); local_28 = local_28 + 1) {
    prVar5 = at(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x18df14);
    rVar1 = *prVar5;
    prVar5 = Vector::operator[]((Vector *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)*prVar5),ZEXT416((uint)rVar1),ZEXT416((uint)local_1c));
    local_1c = auVar2._0_4_;
  }
  uVar3 = std::isnan((double)(ulong)(uint)local_1c);
  if ((uVar3 & 1) == 0) {
    return local_1c;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Encountered NaN.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

real Matrix::dotRow(const Vector& vec, int64_t i) const {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  real d = 0.0;
  for (int64_t j = 0; j < n_; j++) {
    d += at(i, j) * vec[j];
  }
  if (std::isnan(d)) {
    throw std::runtime_error("Encountered NaN.");
  }
  return d;
}